

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  if (factor < 3) {
    iVar7 = 0;
    if (0 < factor) {
      iVar7 = factor;
    }
    while (bVar11 = iVar7 != 0, iVar7 = iVar7 + -1, bVar11) {
      SubtractBignum(this,other);
    }
  }
  else {
    sVar1 = other->exponent_;
    sVar2 = this->exponent_;
    sVar3 = other->used_bigits_;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < sVar3) {
      uVar9 = (ulong)(uint)(int)sVar3;
    }
    lVar5 = (long)sVar1 * 4 + (long)sVar2 * -4 + 4;
    uVar10 = 0;
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      uVar6 = (ulong)uVar10 + (ulong)other->bigits_buffer_[uVar8] * (ulong)(uint)factor;
      uVar10 = *(int *)((long)this + uVar8 * 4 + lVar5) - ((uint)uVar6 & 0xfffffff);
      *(uint *)((long)this + uVar8 * 4 + lVar5) = uVar10 & 0xfffffff;
      uVar10 = (int)(uVar6 >> 0x1c) - ((int)uVar10 >> 0x1f);
    }
    sVar4 = this->used_bigits_;
    lVar5 = (long)(((int)sVar1 - (int)sVar2) + (int)sVar3);
    while( true ) {
      if (sVar4 <= lVar5) {
        Clamp(this);
        return;
      }
      if (uVar10 == 0) break;
      uVar10 = this->bigits_buffer_[lVar5] - uVar10;
      this->bigits_buffer_[lVar5] = uVar10 & 0xfffffff;
      uVar10 = uVar10 >> 0x1f;
      lVar5 = lVar5 + 1;
    }
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, const int factor) {
  DOUBLE_CONVERSION_ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  const int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_bigits_; ++i) {
    const DoubleChunk product = static_cast<DoubleChunk>(factor) * other.RawBigit(i);
    const DoubleChunk remove = borrow + product;
    const Chunk difference = RawBigit(i + exponent_diff) - (remove & kBigitMask);
    RawBigit(i + exponent_diff) = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_bigits_ + exponent_diff; i < used_bigits_; ++i) {
    if (borrow == 0) {
      return;
    }
    const Chunk difference = RawBigit(i) - borrow;
    RawBigit(i) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}